

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

void __thiscall
ImDrawList::AddCircle
          (ImDrawList *this,ImVec2 *center,float radius,ImU32 col,int num_segments,float thickness)

{
  int iVar1;
  int iVar2;
  
  if (0.0 < radius && 0xffffff < col) {
    if (num_segments < 1) {
      _PathArcToFastEx(this,center,radius + -0.5,0,0x30,0);
      (this->_Path).Size = (this->_Path).Size + -1;
    }
    else {
      iVar1 = 0x200;
      if (num_segments < 0x200) {
        iVar1 = num_segments;
      }
      iVar2 = 3;
      if (3 < iVar1) {
        iVar2 = iVar1;
      }
      PathArcTo(this,center,radius + -0.5,0.0,((float)(iVar2 + -1) * 6.2831855) / (float)iVar2,
                iVar2 + -1);
    }
    AddPolyline(this,(this->_Path).Data,(this->_Path).Size,col,1,thickness);
    (this->_Path).Size = 0;
  }
  return;
}

Assistant:

void ImDrawList::AddCircle(const ImVec2& center, float radius, ImU32 col, int num_segments, float thickness)
{
    if ((col & IM_COL32_A_MASK) == 0 || radius <= 0.0f)
        return;

    if (num_segments <= 0)
    {
        // Use arc with automatic segment count
        _PathArcToFastEx(center, radius - 0.5f, 0, IM_DRAWLIST_ARCFAST_SAMPLE_MAX, 0);
        _Path.Size--;
    }
    else
    {
        // Explicit segment count (still clamp to avoid drawing insanely tessellated shapes)
        num_segments = ImClamp(num_segments, 3, IM_DRAWLIST_CIRCLE_AUTO_SEGMENT_MAX);

        // Because we are filling a closed shape we remove 1 from the count of segments/points
        const float a_max = (IM_PI * 2.0f) * ((float)num_segments - 1.0f) / (float)num_segments;
        PathArcTo(center, radius - 0.5f, 0.0f, a_max, num_segments - 1);
    }

    PathStroke(col, ImDrawFlags_Closed, thickness);
}